

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O2

params_t * __thiscall
iutest::detail::iuCsvFileParamsGenerator<int>::ReadParams
          (params_t *__return_storage_ptr__,iuCsvFileParamsGenerator<int> *this,string *path,
          char delimiter)

{
  int iVar1;
  IFile *ptr;
  long lVar2;
  ostream *poVar3;
  string dataset;
  string data;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ptr = IFileSystem::New();
  if (ptr != (IFile *)0x0) {
    iVar1 = (*(ptr->super_IOutStream)._vptr_IOutStream[5])(ptr,(path->_M_dataplus)._M_p,1);
    if ((char)iVar1 != '\0') {
      (*(ptr->super_IInStream)._vptr_IInStream[4])(&dataset,&ptr->super_IInStream);
      while( true ) {
        lVar2 = std::__cxx11::string::find((char)&dataset,(ulong)(uint)(int)delimiter);
        if (lVar2 == -1) break;
        std::__cxx11::string::substr((ulong)&data,(ulong)&dataset);
        AppendParams(this,__return_storage_ptr__,&data);
        std::__cxx11::string::~string((string *)&data);
      }
      std::__cxx11::string::substr((ulong)&data,(ulong)&dataset);
      AppendParams(this,__return_storage_ptr__,&data);
      std::__cxx11::string::~string((string *)&data);
      if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        IUTestLog::IUTestLog
                  ((IUTestLog *)&data,LOG_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/../include/internal/iutest_genparams_from_file.hpp"
                   ,0x4d);
        poVar3 = std::operator<<((ostream *)((long)&data.field_2 + 8),"Empty params file \"");
        poVar3 = std::operator<<(poVar3,(string *)path);
        std::operator<<(poVar3,"\".");
        IUTestLog::~IUTestLog((IUTestLog *)&data);
      }
      std::__cxx11::string::~string((string *)&dataset);
      goto LAB_001e8388;
    }
  }
  IUTestLog::IUTestLog
            ((IUTestLog *)&data,LOG_WARNING,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/../include/internal/iutest_genparams_from_file.hpp"
             ,0x52);
  poVar3 = std::operator<<((ostream *)((long)&data.field_2 + 8),"Unable to open file \"");
  poVar3 = std::operator<<(poVar3,(string *)path);
  std::operator<<(poVar3,"\".");
  IUTestLog::~IUTestLog((IUTestLog *)&data);
LAB_001e8388:
  IFileSystem::Free(ptr);
  return __return_storage_ptr__;
}

Assistant:

params_t ReadParams(const ::std::string& path, char delimiter = ',')
    {
        params_t params;
        IFile* fp = detail::IFileSystem::New();
        if( (fp != NULL) && fp->Open(path.c_str(), IFile::OpenRead) )
        {
            const ::std::string dataset = fp->ReadAll();
            ::std::string::size_type prev = 0;
            ::std::string::size_type pos = 0;
            while( static_cast<void>(pos = dataset.find(delimiter, prev)), pos != ::std::string::npos )
            {
                const ::std::string data = dataset.substr(prev, pos - prev);
                AppendParams(params, data);
                ++pos;
                prev = pos;
            }
            AppendParams(params, dataset.substr(prev));

            if( params.empty() )
            {
                IUTEST_LOG_(WARNING) << "Empty params file \"" << path << "\".";
            }
        }
        else
        {
            IUTEST_LOG_(WARNING) << "Unable to open file \"" << path << "\".";
        }
        detail::IFileSystem::Free(fp);
        return params;
    }